

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_aat.c
# Opt level: O2

size_t amd_l_aat(longlong n,longlong *Ap,longlong *Ai,longlong *Len,longlong *Tp,c_float *Info)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  longlong lVar10;
  long lVar11;
  longlong lVar12;
  c_float cVar13;
  undefined1 auVar14 [16];
  
  if (Info != (c_float *)0x0) {
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
      Info[lVar4] = -1.0;
    }
    *Info = 0.0;
  }
  lVar5 = 0;
  lVar4 = 0;
  if (0 < n) {
    lVar4 = n;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    Len[lVar5] = 0;
  }
  lVar5 = Ap[n];
  lVar9 = 0;
  lVar6 = 0;
  lVar8 = 0;
  do {
    if (lVar8 == lVar4) {
      lVar8 = 0;
      while (lVar11 = lVar8, lVar11 != lVar4) {
        for (lVar12 = Tp[lVar11]; lVar8 = lVar11 + 1, lVar12 < Ap[lVar11 + 1]; lVar12 = lVar12 + 1)
        {
          Len[Ai[lVar12]] = Len[Ai[lVar12]] + 1;
          Len[lVar11] = Len[lVar11] + 1;
        }
      }
      lVar8 = lVar5 - lVar9;
      if (lVar8 == 0) {
        cVar13 = 1.0;
      }
      else {
        cVar13 = ((double)lVar6 + (double)lVar6) / (double)lVar8;
      }
      sVar7 = 0;
      for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
        sVar7 = sVar7 + Len[lVar8];
      }
      if (Info != (c_float *)0x0) {
        *Info = 0.0;
        Info[1] = (double)n;
        Info[2] = (double)lVar5;
        Info[3] = cVar13;
        Info[4] = (double)lVar9;
        auVar14._8_4_ = (int)(sVar7 >> 0x20);
        auVar14._0_8_ = sVar7;
        auVar14._12_4_ = 0x45300000;
        Info[5] = (auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0);
      }
      return sVar7;
    }
    lVar12 = Ap[lVar8];
    lVar11 = Ap[lVar8 + 1];
    while (lVar12 < lVar11) {
      lVar1 = Ai[lVar12];
      if (lVar8 <= lVar1) {
        if (lVar1 == lVar8) {
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 1;
        }
        break;
      }
      Len[lVar1] = Len[lVar1] + 1;
      Len[lVar8] = Len[lVar8] + 1;
      lVar12 = lVar12 + 1;
      lVar2 = Ap[lVar1 + 1];
      for (lVar10 = Tp[lVar1]; lVar10 < lVar2; lVar10 = lVar10 + 1) {
        lVar3 = Ai[lVar10];
        if (lVar8 <= lVar3) {
          if (lVar3 == lVar8) {
            lVar10 = lVar10 + 1;
            lVar6 = lVar6 + 1;
          }
          break;
        }
        Len[lVar3] = Len[lVar3] + 1;
        Len[lVar1] = Len[lVar1] + 1;
      }
      Tp[lVar1] = lVar10;
    }
    Tp[lVar8] = lVar12;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

GLOBAL size_t AMD_aat	/* returns nz in A+A' */
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int Len [ ],	/* Len [j]: length of column j of A+A', excl diagonal*/
    Int Tp [ ],		/* workspace of size n */
    c_float Info [ ]
)
{
    Int p1, p2, p, i, j, pj, pj2, k, nzdiag, nzboth, nz ;
    c_float sym ;
    size_t nzaat ;

#ifndef NDEBUG
    AMD_debug_init ("AMD AAT") ;
    for (k = 0 ; k < n ; k++) Tp [k] = EMPTY ;
    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;
#endif

    if (Info != (c_float *) NULL)
    {
	/* clear the Info array, if it exists */
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_STATUS] = AMD_OK ;
    }

    for (k = 0 ; k < n ; k++)
    {
	Len [k] = 0 ;
    }

    nzdiag = 0 ;
    nzboth = 0 ;
    nz = Ap [n] ;

    for (k = 0 ; k < n ; k++)
    {
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;
	AMD_DEBUG2 (("\nAAT Column: "ID" p1: "ID" p2: "ID"\n", k, p1, p2)) ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    if (j < k)
	    {
		/* entry A (j,k) is in the strictly upper triangular part,
		 * add both A (j,k) and A (k,j) to the matrix A+A' */
		Len [j]++ ;
		Len [k]++ ;
		AMD_DEBUG3 (("    upper ("ID","ID") ("ID","ID")\n", j,k, k,j));
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		nzdiag++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Tp [j] != EMPTY) ;
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper.
		     * add both A (i,j) and A (j,i) to the matrix A+A' */
		    Len [i]++ ;
		    Len [j]++ ;
		    AMD_DEBUG3 (("    lower ("ID","ID") ("ID","ID")\n",
			i,j, j,i)) ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    nzboth++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	/* Tp [k] points to the entry just below the diagonal in column k */
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    /* A (i,j) is only in the lower part, not in upper.
	     * add both A (i,j) and A (j,i) to the matrix A+A' */
	    Len [i]++ ;
	    Len [j]++ ;
	    AMD_DEBUG3 (("    lower cleanup ("ID","ID") ("ID","ID")\n",
		i,j, j,i)) ;
	}
    }

    /* --------------------------------------------------------------------- */
    /* compute the symmetry of the nonzero pattern of A */
    /* --------------------------------------------------------------------- */

    /* Given a matrix A, the symmetry of A is:
     *	B = tril (spones (A), -1) + triu (spones (A), 1) ;
     *  sym = nnz (B & B') / nnz (B) ;
     *  or 1 if nnz (B) is zero.
     */

    if (nz == nzdiag)
    {
	sym = 1 ;
    }
    else
    {
	sym = (2 * (c_float) nzboth) / ((c_float) (nz - nzdiag)) ;
    }

    nzaat = 0 ;
    for (k = 0 ; k < n ; k++)
    {
	nzaat += Len [k] ;
    }

    AMD_DEBUG1 (("AMD nz in A+A', excluding diagonal (nzaat) = %g\n",
	(c_float) nzaat)) ;
    AMD_DEBUG1 (("   nzboth: "ID" nz: "ID" nzdiag: "ID" symmetry: %g\n",
		nzboth, nz, nzdiag, sym)) ;

    if (Info != (c_float *) NULL)
    {
	Info [AMD_STATUS] = AMD_OK ;
	Info [AMD_N] = n ;
	Info [AMD_NZ] = nz ;
	Info [AMD_SYMMETRY] = sym ;	    /* symmetry of pattern of A */
	Info [AMD_NZDIAG] = nzdiag ;	    /* nonzeros on diagonal of A */
	Info [AMD_NZ_A_PLUS_AT] = nzaat ;   /* nonzeros in A+A' */
    }

    return (nzaat) ;
}